

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O0

void __thiscall QPainter::eraseRect(QPainter *this,QRect *rect)

{
  long lVar1;
  QRect *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRectF::QRectF(in_RDI,in_RSI);
  QPainter::eraseRect((QRectF *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::eraseRect(const QRect &rect)
{
    eraseRect(QRectF(rect));
}